

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOrder.c
# Opt level: O1

void Abc_NtkImplementCiOrder(Abc_Ntk_t *pNtk,char *pFileName,int fReverse,int fVerbose)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  Vec_Ptr_t *vSupp;
  void **ppvVar4;
  Abc_Obj_t *pAVar5;
  int iVar6;
  char Buffer [1000];
  char local_418 [1000];
  
  __stream = fopen(pFileName,"r");
  iVar2 = pNtk->vCis->nSize;
  vSupp = (Vec_Ptr_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < iVar2 - 1U) {
    iVar6 = iVar2;
  }
  vSupp->nSize = 0;
  vSupp->nCap = iVar6;
  if (iVar6 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar6 << 3);
  }
  vSupp->pArray = ppvVar4;
  iVar2 = __isoc99_fscanf(__stream,"%s",local_418);
  if (iVar2 == 1) {
    do {
      pAVar5 = Abc_NtkFindCi(pNtk,local_418);
      if ((pAVar5 == (Abc_Obj_t *)0x0) ||
         ((uVar3 = *(uint *)&pAVar5->field_0x14 & 0xf, uVar3 != 2 && (uVar3 != 5)))) {
        printf("Name \"%s\" is not a PI name. Cannot use this order.\n",local_418);
        if (vSupp->pArray != (void **)0x0) {
          free(vSupp->pArray);
          vSupp->pArray = (void **)0x0;
        }
        free(vSupp);
        fclose(__stream);
        return;
      }
      uVar3 = vSupp->nSize;
      uVar1 = vSupp->nCap;
      if (uVar3 == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (vSupp->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(vSupp->pArray,0x80);
          }
          iVar2 = 0x10;
        }
        else {
          iVar2 = uVar1 * 2;
          if (iVar2 <= (int)uVar1) goto LAB_002e76da;
          if (vSupp->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(vSupp->pArray,(ulong)uVar1 << 4);
          }
        }
        vSupp->pArray = ppvVar4;
        vSupp->nCap = iVar2;
      }
LAB_002e76da:
      vSupp->nSize = uVar3 + 1;
      vSupp->pArray[(int)uVar3] = pAVar5;
      iVar2 = __isoc99_fscanf(__stream,"%s",local_418);
    } while (iVar2 == 1);
  }
  fclose(__stream);
  if (vSupp->nSize == pNtk->vCis->nSize) {
    Abc_NtkChangeCiOrder(pNtk,vSupp,fReverse);
  }
  else {
    printf("The number of names in the order (%d) is not the same as the number of PIs (%d).\n");
  }
  if (vSupp->pArray != (void **)0x0) {
    free(vSupp->pArray);
    vSupp->pArray = (void **)0x0;
  }
  free(vSupp);
  return;
}

Assistant:

void Abc_NtkImplementCiOrder( Abc_Ntk_t * pNtk, char * pFileName, int fReverse, int fVerbose )
{
    char Buffer[1000];
    FILE * pFile;
    Vec_Ptr_t * vSupp;
    Abc_Obj_t * pObj;
    pFile = fopen( pFileName, "r" );
    vSupp = Vec_PtrAlloc( Abc_NtkCiNum(pNtk) );
    while ( fscanf( pFile, "%s", Buffer ) == 1 )
    {
        pObj = Abc_NtkFindCi( pNtk, Buffer );
        if ( pObj == NULL || !Abc_ObjIsCi(pObj) )
        {
            printf( "Name \"%s\" is not a PI name. Cannot use this order.\n", Buffer );
            Vec_PtrFree( vSupp );
            fclose( pFile );
            return;
        }
        Vec_PtrPush( vSupp, pObj );
    }
    fclose( pFile );
    if ( Vec_PtrSize(vSupp) != Abc_NtkCiNum(pNtk) )
    {
        printf( "The number of names in the order (%d) is not the same as the number of PIs (%d).\n", Vec_PtrSize(vSupp), Abc_NtkCiNum(pNtk) );
        Vec_PtrFree( vSupp );
        return;
    }
    Abc_NtkChangeCiOrder( pNtk, vSupp, fReverse );
    Vec_PtrFree( vSupp );
}